

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void TestFixAllocator(void)

{
  People PVar1;
  People *pPVar2;
  FixedAllocator<People> local_30;
  
  puts("===================== TestFixAllocator BEGIN ===================");
  local_30.inited = false;
  local_30.construct = true;
  PVar1 = (People)tcmalloc::FixedAllocator<People>::Alloc(&local_30);
  pPVar2 = tcmalloc::FixedAllocator<People>::Alloc(&local_30);
  if (PVar1 == (People)0x0) {
    __assert_fail("p1 != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x1b,"void TestFixAllocator()");
  }
  if (pPVar2 == (People *)0x0) {
    __assert_fail("p2 != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x1c,"void TestFixAllocator()");
  }
  if (local_30.area_ == (char *)0x0) {
    __assert_fail("old_area != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x1e,"void TestFixAllocator()");
  }
  *(undefined4 *)PVar1 = 0x12;
  if (local_30.freelist_ != (void *)0x0) {
    __assert_fail("allocator.FreeListEmpty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x23,"void TestFixAllocator()");
  }
  if (local_30.inited == false) {
    __assert_fail("inited",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/fixed_allocator.hpp"
                  ,0x22,"void tcmalloc::FixedAllocator<People>::Free(T *) [T = People]");
  }
  *(People *)PVar1 = (People)0x0;
  *pPVar2 = PVar1;
  local_30.freelist_ = pPVar2;
  pPVar2 = tcmalloc::FixedAllocator<People>::Alloc(&local_30);
  if (pPVar2 == (People *)0x0) {
    __assert_fail("allocator.Alloc() != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x29,"void TestFixAllocator()");
  }
  if ((People *)local_30.freelist_ == (People *)0x0) {
    __assert_fail("!allocator.FreeListEmpty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x2a,"void TestFixAllocator()");
  }
  pPVar2 = tcmalloc::FixedAllocator<People>::Alloc(&local_30);
  if (pPVar2 != (People *)0x0) {
    if ((People *)local_30.freelist_ != (People *)0x0) {
      __assert_fail("allocator.FreeListEmpty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                    ,0x2c,"void TestFixAllocator()");
    }
    if (local_30.area_ != (char *)0x0) {
      puts("===================== TestFixAllocator PASS =====================");
      return;
    }
    __assert_fail("old_area = allocator.Area()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x2d,"void TestFixAllocator()");
  }
  __assert_fail("allocator.Alloc() != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                ,0x2b,"void TestFixAllocator()");
}

Assistant:

void TestFixAllocator() {
    printf("===================== TestFixAllocator BEGIN ===================\n");
    struct People {
        People(int age) : age_(age) {}
        int     age_;
        int     padding;
    };

    tcmalloc::FixedAllocator<People> allocator;
    People* p1 = allocator.Alloc();
    People* p2 = allocator.Alloc();
    assert(p1 != nullptr);
    assert(p2 != nullptr);
    char *old_area = allocator.Area();
    assert(old_area != nullptr);

    p1 = new (p1) People(18);
    p1->~People();

    assert(allocator.FreeListEmpty());
    allocator.Free(p1);
    assert(!allocator.FreeListEmpty());
    allocator.Free(p2);
    assert(!allocator.FreeListEmpty());

    assert(allocator.Alloc() != nullptr);
    assert(!allocator.FreeListEmpty());
    assert(allocator.Alloc() != nullptr);
    assert(allocator.FreeListEmpty());
    assert(old_area = allocator.Area());

    printf("===================== TestFixAllocator PASS =====================\n");
}